

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> *nameStack)

{
  pointer pSVar1;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pSVar5;
  pointer __s;
  size_type *local_70;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar5 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (nameStack->super__Vector_base<doctest::String,_std::allocator<doctest::String>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    do {
      if ((pSVar5->field_0).buf[0x17] < '\0') {
        uVar3 = (pSVar5->field_0).data.size;
      }
      else {
        uVar3 = 0x17 - ((byte)(pSVar5->field_0).buf[0x17] & 0x1f);
      }
      if (uVar3 != 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
        __s = pSVar5;
        if ((pSVar5->field_0).buf[0x17] < '\0') {
          __s = (pointer)(pSVar5->field_0).data.ptr;
        }
        pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50,(char *)__s);
        local_70 = (size_type *)(pbVar2->_M_dataplus)._M_p;
        paVar4 = &pbVar2->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70 == paVar4) {
          local_60 = paVar4->_M_allocated_capacity;
          uStack_58 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
          local_70 = &local_60;
        }
        else {
          local_60 = paVar4->_M_allocated_capacity;
        }
        __n = pbVar2->_M_string_length;
        (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
        pbVar2->_M_string_length = 0;
        (pbVar2->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&(this->testcases).
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].name,(char *)local_70,__n);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  return;
}

Assistant:

String toString(const DOCTEST_REF_WRAP(T) value) {
        typedef typename detail::underlying_type<T>::type UT;
        return toString(static_cast<UT>(value));
    }